

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::dereference_expression
          (CompilerGLSL *this,SPIRType *expr_type,string *expr)

{
  bool bVar1;
  char *pcVar2;
  Variant *in_RCX;
  undefined1 local_50 [48];
  string *expr_local;
  SPIRType *expr_type_local;
  CompilerGLSL *this_local;
  
  local_50._40_8_ = in_RCX;
  expr_local = expr;
  expr_type_local = expr_type;
  this_local = this;
  pcVar2 = (char *)::std::__cxx11::string::front();
  if (*pcVar2 == '&') {
    ::std::__cxx11::string::substr((ulong)this,local_50._40_8_);
  }
  else if ((expr_type[0x17].member_name_cache._M_h._M_rehash_policy._M_next_resize & 0x10000) == 0)
  {
    bVar1 = Compiler::is_physical_pointer((Compiler *)expr_type,(SPIRType *)expr_local);
    if ((!bVar1) ||
       (bVar1 = Compiler::is_physical_pointer_to_buffer_block
                          ((Compiler *)expr_type,(SPIRType *)expr_local), bVar1)) {
      ::std::__cxx11::string::string((string *)this,(string *)local_50._40_8_);
    }
    else {
      enclose_expression((CompilerGLSL *)local_50,(string *)expr_type);
      join<std::__cxx11::string,char_const(&)[7]>
                ((spirv_cross *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (char (*) [7])".value");
      ::std::__cxx11::string::~string((string *)local_50);
    }
  }
  else {
    local_50[0x27] = 0x2a;
    join<char,std::__cxx11::string_const&>
              ((spirv_cross *)this,local_50 + 0x27,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._40_8_)
    ;
  }
  return this;
}

Assistant:

string CompilerGLSL::dereference_expression(const SPIRType &expr_type, const std::string &expr)
{
	// If this expression starts with an address-of operator ('&'), then
	// just return the part after the operator.
	// TODO: Strip parens if unnecessary?
	if (expr.front() == '&')
		return expr.substr(1);
	else if (backend.native_pointers)
		return join('*', expr);
	else if (is_physical_pointer(expr_type) && !is_physical_pointer_to_buffer_block(expr_type))
		return join(enclose_expression(expr), ".value");
	else
		return expr;
}